

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O2

int main(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *optlen;
  long lVar5;
  long *plVar6;
  char *in_RCX;
  int *address;
  nn_iovec *address_00;
  ulong uVar7;
  int sock;
  int sock_00;
  int sock_01;
  int sock_02;
  int sock_03;
  int sock_04;
  int sock_05;
  int sock_06;
  int sock_07;
  int sock_08;
  int sock_09;
  int sock_10;
  int sock_11;
  int sock_12;
  int sock_13;
  int sock_14;
  int sock_15;
  int sock_16;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar8;
  undefined8 extraout_RDX_08;
  char *pcVar9;
  FILE *__stream;
  undefined8 in_R8;
  void *in_R9;
  bool bVar10;
  undefined8 uStackY_190;
  uchar body [3];
  void *control;
  int val;
  nn_iovec iovec;
  nn_msghdr hdr;
  char buf [256];
  
  iVar1 = test_socket_impl((char *)0x34,1,0x10,(int)in_RCX);
  test_connect_impl((char *)0x35,iVar1,sock,in_RCX);
  iVar2 = test_socket_impl((char *)0x36,1,0x10,(int)in_RCX);
  test_bind_impl((char *)0x37,iVar2,sock_00,in_RCX);
  iVar3 = nn_bind(iVar1,"inproc://test");
  if ((iVar3 < 0) && (optlen = (uint *)__errno_location(), *optlen == 0x62)) {
    iVar3 = 100;
    uVar8 = extraout_RDX;
    while (bVar10 = iVar3 != 0, iVar3 = iVar3 + -1, bVar10) {
      test_send_impl((char *)0x40,iVar1,0x102153,in_RCX);
      test_recv_impl((char *)0x41,iVar2,0x102153,in_RCX);
      test_send_impl((char *)0x42,iVar2,0x102157,in_RCX);
      test_recv_impl((char *)0x43,iVar1,0x102157,in_RCX);
      uVar8 = extraout_RDX_00;
    }
    iVar3 = 100;
    while (bVar10 = iVar3 != 0, iVar3 = iVar3 + -1, bVar10) {
      test_send_impl((char *)0x48,iVar1,0x10215c,in_RCX);
      uVar8 = extraout_RDX_01;
    }
    iVar3 = 100;
    while( true ) {
      iVar4 = (int)in_R8;
      bVar10 = iVar3 == 0;
      iVar3 = iVar3 + -1;
      if (bVar10) break;
      test_recv_impl((char *)0x4b,iVar2,0x10215c,in_RCX);
      uVar8 = extraout_RDX_02;
    }
    test_close_impl((char *)0x4e,iVar1,(int)uVar8);
    iVar1 = (int)in_RCX;
    test_close_impl((char *)0x4f,iVar2,sock_01);
    iVar2 = test_socket_impl((char *)0x52,1,0x10,iVar1);
    address = &val;
    val = 200;
    iVar1 = (int)address;
    test_setsockopt_impl((char *)0x54,iVar2,3,iVar1,iVar4,in_R9,(size_t)optlen);
    test_bind_impl((char *)0x55,iVar2,sock_02,(char *)address);
    iVar3 = test_socket_impl((char *)0x56,1,0x10,(int)address);
    test_connect_impl((char *)0x57,iVar3,sock_03,(char *)address);
    val = 200;
    test_setsockopt_impl((char *)0x5a,iVar3,4,iVar1,iVar4,in_R9,(size_t)optlen);
    iVar1 = 0x14;
    while( true ) {
      pcVar9 = (char *)0x0;
      iVar4 = nn_send(iVar3,"0123456789",10);
      if (iVar4 < 0) break;
      if (iVar4 != 10) {
        pcVar9 = "rc == 10";
        uStackY_190 = 0x61;
        goto LAB_00101933;
      }
      iVar1 = iVar1 + -1;
    }
    iVar4 = nn_errno();
    __stream = _stderr;
    if (iVar4 != 0x6e) {
      pcVar9 = nn_err_strerror(*optlen);
      uVar7 = (ulong)*optlen;
      uStackY_190 = 0x60;
      goto LAB_00101a8d;
    }
    if (iVar1 == 0) {
      test_recv_impl((char *)0x65,iVar2,0x102160,pcVar9);
      test_send_impl((char *)0x66,iVar3,0x102160,pcVar9);
      pcVar9 = (char *)0x0;
      iVar1 = nn_send(iVar3,"0123456789",10);
      if ((iVar1 < 0) && (iVar1 = nn_errno(), iVar1 == 0x6e)) {
        iVar1 = 0x14;
        while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
          test_recv_impl((char *)0x6a,iVar2,0x102160,pcVar9);
        }
        for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
          buf[lVar5] = 'A';
        }
        iVar1 = nn_send(iVar3,buf,0x100);
        __stream = _stderr;
        if (iVar1 < 0) {
          pcVar9 = nn_err_strerror(*optlen);
          uVar7 = (ulong)*optlen;
          uStackY_190 = 0x72;
LAB_00101a8d:
          fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar9,uVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c"
                  ,uStackY_190);
          goto LAB_0010193d;
        }
        if (iVar1 == 0x100) {
          pcVar9 = (char *)0x0;
          iVar1 = nn_recv(iVar2,buf,0x100);
          __stream = _stderr;
          if (iVar1 < 0) {
            pcVar9 = nn_err_strerror(*optlen);
            uVar7 = (ulong)*optlen;
            uStackY_190 = 0x75;
            goto LAB_00101a8d;
          }
          if (iVar1 == 0x100) {
            test_close_impl((char *)0x78,iVar3,sock_04);
            test_close_impl((char *)0x79,iVar2,sock_05);
            iVar1 = test_socket_impl((char *)0x8a,2,0x31,(int)pcVar9);
            test_bind_impl((char *)0x8b,iVar1,sock_06,pcVar9);
            iVar2 = test_socket_impl((char *)0x8c,1,0x30,(int)pcVar9);
            test_connect_impl((char *)0x8d,iVar2,sock_07,pcVar9);
            test_send_impl((char *)0x8f,iVar2,0x102153,pcVar9);
            iovec.iov_base = body;
            address_00 = &iovec;
            iovec.iov_len = 3;
            hdr.msg_iovlen = 1;
            hdr.msg_control = &control;
            hdr.msg_controllen = 0xffffffffffffffff;
            hdr.msg_iov = address_00;
            iVar3 = nn_recvmsg(iVar1,&hdr,0);
            __stream = _stderr;
            if (iVar3 != 3) {
              pcVar9 = nn_err_strerror(*optlen);
              uVar7 = (ulong)*optlen;
              uStackY_190 = 0x98;
              goto LAB_00101a8d;
            }
            plVar6 = (long *)0x0;
            do {
              plVar6 = (long *)nn_cmsg_nxthdr_(&hdr,plVar6);
              if (plVar6 == (long *)0x0) {
                pcVar9 = "cmsg";
                uStackY_190 = 0x9c;
                goto LAB_00101933;
              }
            } while (((int)plVar6[1] != 1) || (*(int *)((long)plVar6 + 0xc) != 1));
            if (*plVar6 == 0x20) {
              if ((char)plVar6[3] < '\0') {
                pcVar9 = "!(data[0+sizeof (size_t)] & 0x80)";
                uStackY_190 = 0xa3;
              }
              else {
                if (*(char *)((long)plVar6 + 0x1c) < '\0') {
                  nn_freemsg(control);
                  test_close_impl((char *)0xa8,iVar2,sock_08);
                  test_close_impl((char *)0xa9,iVar1,sock_09);
                  iVar1 = test_socket_impl((char *)0xac,1,0x70,(int)address_00);
                  test_bind_impl((char *)0xad,iVar1,sock_10,(char *)address_00);
                  iVar2 = test_socket_impl((char *)0xaf,1,0x70,(int)address_00);
                  test_connect_impl((char *)0xb0,iVar2,sock_11,(char *)address_00);
                  iVar3 = test_socket_impl((char *)0xb2,1,0x70,(int)address_00);
                  test_connect_impl((char *)0xb3,iVar3,sock_12,(char *)address_00);
                  test_close_impl((char *)0xb6,iVar1,sock_13);
                  iVar1 = 100;
                  nn_sleep(100);
                  iVar4 = test_socket_impl((char *)0xbb,1,0x70,(int)address_00);
                  test_bind_impl((char *)0xbc,iVar4,sock_14,(char *)address_00);
                  uVar8 = extraout_RDX_03;
                  while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
                    test_send_impl((char *)0xc1,iVar2,0x102153,(char *)address_00);
                    test_send_impl((char *)0xc2,iVar3,0x102223,(char *)address_00);
                    test_recv_impl((char *)0xc3,iVar4,0x102153,(char *)address_00);
                    test_recv_impl((char *)0xc4,iVar4,0x102223,(char *)address_00);
                    test_send_impl((char *)0xc5,iVar4,0x102157,(char *)address_00);
                    test_recv_impl((char *)0xc6,iVar2,0x102157,(char *)address_00);
                    test_recv_impl((char *)0xc7,iVar3,0x102157,(char *)address_00);
                    uVar8 = extraout_RDX_04;
                  }
                  iVar1 = 100;
                  while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
                    test_send_impl((char *)0xcc,iVar2,0x10215c,(char *)address_00);
                    uVar8 = extraout_RDX_05;
                  }
                  iVar1 = 100;
                  while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
                    test_recv_impl((char *)0xcf,iVar4,0x10215c,(char *)address_00);
                    uVar8 = extraout_RDX_06;
                  }
                  iVar1 = 100;
                  while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
                    test_send_impl((char *)0xd2,iVar3,0x102227,(char *)address_00);
                    uVar8 = extraout_RDX_07;
                  }
                  iVar1 = 100;
                  while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
                    test_recv_impl((char *)0xd5,iVar4,0x102227,(char *)address_00);
                    uVar8 = extraout_RDX_08;
                  }
                  test_close_impl((char *)0xd8,iVar3,(int)uVar8);
                  test_close_impl((char *)0xd9,iVar2,sock_15);
                  test_close_impl((char *)0xda,iVar4,sock_16);
                  return 0;
                }
                pcVar9 = "data[4+sizeof (size_t)] & 0x80";
                uStackY_190 = 0xa4;
              }
            }
            else {
              pcVar9 = "cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t))";
              uStackY_190 = 0xa1;
            }
          }
          else {
            pcVar9 = "rc == 256";
            uStackY_190 = 0x76;
          }
        }
        else {
          pcVar9 = "rc == 256";
          uStackY_190 = 0x73;
        }
      }
      else {
        pcVar9 = "rc < 0 && nn_errno () == ETIMEDOUT";
        uStackY_190 = 0x68;
      }
    }
    else {
      pcVar9 = "i == 20";
      uStackY_190 = 100;
    }
  }
  else {
    pcVar9 = "rc < 0 && errno == EADDRINUSE";
    uStackY_190 = 0x3b;
  }
LAB_00101933:
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar9,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/inproc.c",
          uStackY_190);
LAB_0010193d:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int main ()
{
    int rc;
    int sb;
    int sc;
    int s1, s2;
    int i;
    char buf [256];
    int val;
    struct nn_msghdr hdr;
    struct nn_iovec iovec;
    unsigned char body [3];
    void *control;
    struct nn_cmsghdr *cmsg;
    unsigned char *data;

    /*  Create a simple topology. */
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);

    /*  Try a duplicate bind. It should fail. */
    rc = nn_bind (sc, SOCKET_ADDRESS);
    nn_assert (rc < 0 && errno == EADDRINUSE);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_recv (sb, "ABC");
        test_send (sb, "DEFG");
        test_recv (sc, "DEFG");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (sb, "XYZ");
    }

    test_close (sc);
    test_close (sb);

    /*  Test whether queue limits are observed. */
    sb = test_socket (AF_SP, NN_PAIR);
    val = 200;
    test_setsockopt (sb, NN_SOL_SOCKET, NN_RCVBUF, &val, sizeof (val));
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    val = 200;
    test_setsockopt (sc, NN_SOL_SOCKET, NN_SNDTIMEO, &val, sizeof (val));
    i = 0;
    while (1) {
        rc = nn_send (sc, "0123456789", 10, 0);
        if (rc < 0 && nn_errno () == ETIMEDOUT)
            break;
        errno_assert (rc >= 0);
        nn_assert (rc == 10);
        ++i;
    }
    nn_assert (i == 20);
    test_recv (sb, "0123456789");
    test_send (sc, "0123456789");
    rc = nn_send (sc, "0123456789", 10, 0);
    nn_assert (rc < 0 && nn_errno () == ETIMEDOUT);
    for (i = 0; i != 20; ++i) {
        test_recv (sb, "0123456789");
    }

    /*  Make sure that even a message that doesn't fit into the buffers
        gets across. */
    for (i = 0; i != sizeof (buf); ++i)
        buf [i] = 'A';
    rc = nn_send (sc, buf, 256, 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);
    rc = nn_recv (sb, buf, sizeof (buf), 0);
    errno_assert (rc >= 0);
    nn_assert (rc == 256);

    test_close (sc);
    test_close (sb);

#if 0
    /*  Test whether connection rejection is handled decently. */
    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    s1 = test_socket (AF_SP, NN_PAIR);
    test_connect (s1, SOCKET_ADDRESS);
    s2 = test_socket (AF_SP, NN_PAIR);
    test_connect (s2, SOCKET_ADDRESS);
    nn_sleep (100);
    test_close (s2);
    test_close (s1);
    test_close (sb);
#endif

    /* Check whether SP message header is transferred correctly. */
    sb = test_socket (AF_SP_RAW, NN_REP);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_REQ);
    test_connect (sc, SOCKET_ADDRESS);

    test_send (sc, "ABC");

    iovec.iov_base = body;
    iovec.iov_len = sizeof (body);
    hdr.msg_iov = &iovec;
    hdr.msg_iovlen = 1;
    hdr.msg_control = &control;
    hdr.msg_controllen = NN_MSG;
    rc = nn_recvmsg (sb, &hdr, 0);
    errno_assert (rc == 3);

    cmsg = NN_CMSG_FIRSTHDR (&hdr);
    while (1) {
        nn_assert (cmsg);
        if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR)
            break;
        cmsg = NN_CMSG_NXTHDR (&hdr, cmsg);
    }
    nn_assert (cmsg->cmsg_len == NN_CMSG_SPACE (8+sizeof (size_t)));
    data = NN_CMSG_DATA (cmsg);
    nn_assert (!(data[0+sizeof (size_t)] & 0x80));
    nn_assert (data[4+sizeof (size_t)] & 0x80);

    nn_freemsg (control);

    test_close (sc);
    test_close (sb);

    /* Test binding a new socket after originally bound socket shuts down. */
    sb = test_socket (AF_SP, NN_BUS);
    test_bind (sb, SOCKET_ADDRESS);

    sc = test_socket (AF_SP, NN_BUS);
    test_connect (sc, SOCKET_ADDRESS);

    s1 = test_socket (AF_SP, NN_BUS);
    test_connect (s1, SOCKET_ADDRESS);

    /* Close bound socket, leaving connected sockets connect. */
    test_close (sb);

    nn_sleep (100);

    /* Rebind a new socket to the address to which our connected sockets are listening. */
    s2 = test_socket (AF_SP, NN_BUS);
    test_bind (s2, SOCKET_ADDRESS);

    /*  Ping-pong test. */
    for (i = 0; i != 100; ++i) {

        test_send (sc, "ABC");
        test_send (s1, "QRS");
        test_recv (s2, "ABC");
        test_recv (s2, "QRS");
        test_send (s2, "DEFG");
        test_recv (sc, "DEFG");
        test_recv (s1, "DEFG");
    }

    /*  Batch transfer test. */
    for (i = 0; i != 100; ++i) {
        test_send (sc, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (s2, "XYZ");
    }
    for (i = 0; i != 100; ++i) {
        test_send (s1, "MNO");
    }
    for (i = 0; i != 100; ++i) {
        test_recv (s2, "MNO");
    }

    test_close (s1);
    test_close (sc);
    test_close (s2);

    return 0;
}